

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeRepresentation.hpp
# Opt level: O3

baseType count_time<9,_long>::fromCount(int64_t val,time_units units)

{
  long lVar1;
  
  switch(units) {
  case ps:
    return val / 1000;
  case ns:
    goto switchD_0034c5d2_caseD_1;
  case us:
    return val * 1000;
  case ms:
    return val * 1000000;
  default:
    return val * 1000000000;
  case minutes:
    lVar1 = 60000000000;
    break;
  case hr:
    lVar1 = 3600000000000;
    break;
  case day:
    lVar1 = 86400000000000;
  }
  val = val * lVar1;
switchD_0034c5d2_caseD_1:
  return val;
}

Assistant:

static baseType fromCount(std::int64_t val, time_units units) noexcept
    {
        switch (units) {
            case time_units::ps:
                if constexpr (N >= 12) {
                    return static_cast<baseType>(val * fac10[N - 12]);
                } else {
                    return static_cast<baseType>(val / fac10[12 - N]);
                }
            case time_units::ns:
                if constexpr (N >= 9) {
                    return static_cast<baseType>(val * fac10[N - 9]);
                } else {
                    return static_cast<baseType>(val / fac10[9 - N]);
                }
            case time_units::us:
                if constexpr (N >= 6) {
                    return static_cast<baseType>(val * fac10[N - 6]);
                } else {
                    return static_cast<baseType>(val / fac10[6 - N]);
                }
            case time_units::ms:
                if constexpr (N >= 3) {
                    return static_cast<baseType>(val * fac10[N - 3]);
                } else {
                    return static_cast<baseType>(val / fac10[3 - N]);
                }
            case time_units::s:
            case time_units::sec:
            default:
                return static_cast<baseType>(val * iFactor);
            case time_units::minutes:
                return static_cast<baseType>(val * 60 * iFactor);
            case time_units::hr:
                return static_cast<baseType>(val * 3600 * iFactor);
            case time_units::day:
                return static_cast<baseType>(val * 86400 * iFactor);
        }
    }